

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  iterator iVar5;
  BasicImageIO *pBVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  int depth;
  long local_258;
  long local_250;
  char *local_248;
  long local_240;
  long local_238;
  void *local_230;
  float *local_228;
  long local_220;
  long local_218;
  long local_210;
  float *local_208;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long theight;
  long twidth;
  ImageIO *local_1d0;
  BasicImageIO *local_1c8;
  long local_1c0;
  long tborder;
  int local_1ac;
  string tname;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> timage;
  int local_148;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  
  local_238 = x;
  local_1d0 = this;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar4 = std::__cxx11::string::rfind((char)&s,0x3a);
  if ((uVar4 == 0xffffffffffffffff) ||
     (iVar2 = std::__cxx11::string::compare((ulong)&s,uVar4,(char *)0x2), iVar2 == 0)) {
    pBVar6 = getBasicImageIO(local_1d0,name,true);
    (*pBVar6->_vptr_BasicImageIO[6])(pBVar6,image,name,(ulong)(uint)ds,local_238,y,w,h);
  }
  else {
    local_1c8 = getBasicImageIO(local_1d0,name,true);
    std::__cxx11::string::string((string *)&s_1,name,(allocator *)&timage);
    uVar4 = std::__cxx11::string::rfind((char)&s_1,0x3a);
    if (uVar4 != 0xffffffffffffffff) {
      std::__cxx11::string::compare((ulong)&s_1,uVar4,(char *)0x2);
    }
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
    std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &list._M_t._M_impl.super__Rb_tree_header._M_header;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    anon_unknown_17::loadTiledHeader
              (local_1c8,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
    local_258 = w;
    if (w < 1) {
      local_258 = (width + ds + -1) / (long)ds;
    }
    local_240 = h;
    if (h < 1) {
      local_240 = (height + ds + -1) / (long)ds;
    }
    lVar22 = twidth + tborder * -2;
    lVar16 = theight + tborder * -2;
    local_250 = y;
    local_248 = name;
    if (tborder == 0 && ds == 1) {
      local_1e8 = 0;
      if (0 < local_238) {
        local_1e8 = local_238;
      }
      local_1e8 = local_1e8 / lVar22;
      local_1f0 = (local_258 + local_238 + -1) / lVar22;
      lVar18 = local_240 + y;
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
                (image,local_258,local_240,(long)depth);
      lVar12 = 0;
      if (0 < y) {
        lVar12 = y;
      }
      sVar1 = image->n;
      sVar11 = -sVar1;
      if (0 < (long)sVar1) {
        sVar11 = sVar1;
      }
      memset(image->pixel,0,sVar11);
      iVar2 = (int)(lVar12 / lVar16);
      iVar3 = (int)((lVar18 + -1) / lVar16);
      if (iVar2 <= iVar3) {
        local_258 = local_258 + local_238;
        local_240 = local_240 + local_250;
        local_228 = (float *)(long)(int)local_1e8;
        local_210 = CONCAT44(local_210._4_4_,(int)local_1f0 + 1);
        local_220 = (long)iVar2;
        local_230 = (void *)(ulong)(iVar3 + 1);
        do {
          if ((int)local_1e8 <= (int)local_1f0) {
            local_218 = local_250 - local_220 * lVar16;
            if (local_218 < 1) {
              local_218 = 0;
            }
            lVar18 = local_220 * lVar16 + local_218;
            local_1c0 = local_240 - lVar18;
            lVar18 = lVar18 - local_250;
            pfVar10 = local_228;
            do {
              lVar12 = local_238 - (long)pfVar10 * lVar22;
              if (lVar12 < 1) {
                lVar12 = 0;
              }
              lVar23 = (long)pfVar10 * lVar22 + lVar12;
              lVar21 = local_258 - lVar23;
              if (twidth - lVar12 <= lVar21) {
                lVar21 = twidth - lVar12;
              }
              lVar9 = theight - local_218;
              if (local_1c0 < theight - local_218) {
                lVar9 = local_1c0;
              }
              local_208 = pfVar10;
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_220,(int)pfVar10,&suffix);
              timage.depth = 0;
              timage.row = (uchar **)0x0;
              timage.img = (uchar ***)0x0;
              timage.n = 0;
              timage.pixel = (uchar *)0x0;
              timage.width = 0;
              timage.height = 0;
              Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
                        (&timage,lVar21,lVar9,(long)depth);
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if (((_Rb_tree_header *)iVar5._M_node != &list._M_t._M_impl.super__Rb_tree_header) &&
                 ((*local_1c8->_vptr_BasicImageIO[6])
                            (local_1c8,&timage,tname._M_dataplus._M_p,1,lVar12,local_218,lVar21,
                             lVar9), 0 < timage.height)) {
                lVar12 = 0;
                do {
                  if (0 < timage.width) {
                    uVar4 = (ulong)(uint)depth;
                    lVar21 = 0;
                    do {
                      if (0 < (int)uVar4) {
                        lVar9 = 0;
                        do {
                          image->img[lVar9][lVar18 + lVar12][lVar21 + (lVar23 - local_238)] =
                               timage.img[lVar9][lVar12][lVar21];
                          lVar9 = lVar9 + 1;
                          uVar4 = (ulong)depth;
                        } while (lVar9 < (long)uVar4);
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < timage.width);
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 < timage.height);
              }
              Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              pfVar10 = (float *)((long)local_208 + 1);
            } while ((int)local_210 != (int)pfVar10);
          }
          local_220 = local_220 + 1;
        } while ((int)local_230 != (int)local_220);
      }
    }
    else {
      local_208 = (float *)(long)ds;
      lVar12 = (long)local_208 * local_238;
      lVar18 = lVar12 - tborder;
      if (lVar12 - tborder < 1) {
        lVar18 = 0;
      }
      lVar23 = (long)local_208 * y;
      lVar21 = lVar23 - tborder;
      if (lVar23 - tborder < 1) {
        lVar21 = 0;
      }
      lVar7 = (local_238 + local_258 + -1) * (long)local_208 + tborder;
      local_200 = ((local_240 + y + -1) * (long)local_208 + tborder) / lVar16;
      lVar9 = (long)depth;
      lVar13 = local_258 * local_240;
      uVar4 = lVar13 * 4;
      local_228 = (float *)operator_new(lVar9 * uVar4);
      memset(local_228,0,lVar9 * uVar4);
      local_230 = operator_new(uVar4);
      memset(local_230,0,uVar4);
      lVar9 = local_258;
      iVar2 = (int)(lVar21 / lVar16);
      if (iVar2 <= (int)local_200) {
        lVar14 = (local_258 + local_238) * (long)local_208;
        lVar21 = (local_240 + local_250) * (long)local_208;
        local_148 = (int)(lVar18 / lVar22);
        iVar3 = (int)(lVar7 / lVar22);
        local_1ac = iVar3 + 1;
        local_1f8 = (long)iVar2;
        local_200 = (ulong)((int)local_200 + 1);
        do {
          if (local_148 <= iVar3) {
            lVar7 = local_1f8 * lVar16;
            lVar18 = (long)local_148;
            do {
              lVar24 = tborder - lVar18 * lVar22;
              local_218 = lVar24 + lVar12;
              if (local_218 < 1) {
                local_218 = 0;
              }
              lVar19 = tborder - lVar7;
              local_210 = lVar19 + lVar23;
              if (local_210 < 1) {
                local_210 = 0;
              }
              lVar24 = (lVar24 + lVar14) - local_218;
              if (twidth - local_218 <= lVar24) {
                lVar24 = twidth - local_218;
              }
              lVar19 = (lVar19 + lVar21) - local_210;
              if (theight - local_210 <= lVar19) {
                lVar19 = theight - local_210;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_1f8,(int)lVar18,&suffix);
              timage.depth = 0;
              timage.row = (uchar **)0x0;
              timage.img = (uchar ***)0x0;
              timage.n = 0;
              timage.pixel = (uchar *)0x0;
              timage.width = 0;
              timage.height = 0;
              Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
                        (&timage,lVar24,lVar19,(long)depth);
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if ((_Rb_tree_header *)iVar5._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
                (*local_1c8->_vptr_BasicImageIO[6])
                          (local_1c8,&timage,tname._M_dataplus._M_p,1,local_218,local_210,lVar24,
                           lVar19);
                local_1c0 = timage.height;
                if (0 < timage.height) {
                  fVar26 = (float)tborder + (float)tborder;
                  local_220 = twidth;
                  local_1e8 = theight;
                  local_1f0 = (local_210 + lVar7) - (lVar23 + tborder);
                  lVar24 = 0;
                  do {
                    if (0 < timage.width) {
                      lVar19 = (local_1f0 + lVar24) / (long)local_208;
                      lVar20 = lVar9 * 4 * lVar19;
                      lVar19 = lVar19 * local_258;
                      fVar28 = (float)(local_210 + lVar24) / fVar26;
                      fVar27 = (float)(theight - (local_210 + lVar24)) / fVar26;
                      if (fVar28 <= fVar27) {
                        fVar27 = fVar28;
                      }
                      if (1.0 <= fVar27) {
                        fVar27 = 1.0;
                      }
                      if (fVar27 <= 1e-06) {
                        fVar27 = 1e-06;
                      }
                      lVar25 = 0;
                      do {
                        lVar8 = (lVar25 + ((lVar18 * lVar22 + local_218) - (lVar12 + tborder))) /
                                (long)local_208;
                        if (tborder < 1) {
                          if (0 < depth) {
                            pfVar10 = (float *)((long)local_228 + lVar8 * 4 + lVar20);
                            uVar4 = 0;
                            do {
                              *pfVar10 = (float)timage.img[uVar4][lVar24][lVar25] + *pfVar10;
                              uVar4 = uVar4 + 1;
                              pfVar10 = pfVar10 + lVar13;
                            } while ((uint)depth != uVar4);
                          }
                          fVar28 = *(float *)((long)local_230 + lVar8 * 4 + lVar19 * 4) + 1.0;
                        }
                        else {
                          fVar29 = (float)(local_218 + lVar25) / fVar26;
                          fVar28 = (float)(twidth - (local_218 + lVar25)) / fVar26;
                          if (fVar29 <= fVar28) {
                            fVar28 = fVar29;
                          }
                          if (1.0 <= fVar28) {
                            fVar28 = 1.0;
                          }
                          if (fVar28 <= 1e-06) {
                            fVar28 = 1e-06;
                          }
                          if (0 < depth) {
                            pfVar10 = (float *)((long)local_228 + lVar8 * 4 + lVar20);
                            uVar4 = 0;
                            do {
                              *pfVar10 = (float)timage.img[uVar4][lVar24][lVar25] * fVar28 * fVar27
                                         + *pfVar10;
                              uVar4 = uVar4 + 1;
                              pfVar10 = pfVar10 + lVar13;
                            } while ((uint)depth != uVar4);
                          }
                          fVar28 = fVar28 * fVar27 +
                                   *(float *)((long)local_230 + lVar8 * 4 + lVar19 * 4);
                        }
                        *(float *)((long)local_230 + lVar8 * 4 + lVar19 * 4) = fVar28;
                        lVar25 = lVar25 + 1;
                      } while (lVar25 != timage.width);
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != timage.height);
                }
              }
              Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              lVar18 = lVar18 + 1;
            } while (local_1ac != (int)lVar18);
          }
          local_1f8 = local_1f8 + 1;
        } while ((int)local_200 != (int)local_1f8);
      }
      lVar16 = local_240;
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
                (image,local_258,local_240,(long)depth);
      sVar1 = image->n;
      sVar11 = -sVar1;
      if (0 < (long)sVar1) {
        sVar11 = sVar1;
      }
      memset(image->pixel,0,sVar11);
      if (0 < lVar16) {
        lVar22 = 0;
        pfVar10 = local_228;
        do {
          if (0 < local_258) {
            lVar18 = 0;
            pfVar15 = pfVar10;
            do {
              fVar26 = *(float *)((long)local_230 + lVar18 * 4 + lVar22 * local_258 * 4);
              if ((0.0 < fVar26) && (0 < depth)) {
                lVar12 = 0;
                pfVar17 = pfVar15;
                do {
                  image->img[lVar12][lVar22][lVar18] = (uchar)(int)(*pfVar17 / fVar26);
                  lVar12 = lVar12 + 1;
                  pfVar17 = pfVar17 + lVar13;
                } while (lVar12 < depth);
              }
              lVar18 = lVar18 + 1;
              pfVar15 = pfVar15 + 1;
            } while (lVar18 != local_258);
          }
          lVar22 = lVar22 + 1;
          pfVar10 = pfVar10 + local_258;
        } while (lVar22 != lVar16);
      }
      operator_delete(local_230);
      operator_delete(local_228);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&list._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s_1._M_dataplus._M_p != &s_1.field_2) {
      operator_delete(s_1._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}